

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::writeObj(MakefileGenerator *this,QTextStream *t,char *src)

{
  bool bVar1;
  const_iterator cVar2;
  ProString *this_00;
  QTextStream *pQVar3;
  QTextStream *this_01;
  QMakeProject *this_02;
  ProStringList *pPVar4;
  QTextStream *pQVar5;
  QTextStream *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  ProString *extension;
  ProStringList *__range3;
  ProString *compiler;
  ProStringList *__range2;
  ProStringList *srcl;
  QString p;
  iterator __end3;
  iterator __begin3;
  ProString compilerSuffix;
  ProString extensionSuffix;
  iterator __end2;
  iterator __begin2;
  ProKey comp;
  QString dstf;
  QString srcf;
  QLatin1String stringObj;
  QLatin1String stringSrc;
  ConstIterator sit;
  ConstIterator oit;
  ProStringList objl;
  ProString *in_stack_fffffffffffffbb8;
  QMakeProject *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  QLatin1String *in_stack_fffffffffffffbd0;
  MakefileGenerator *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 uVar6;
  ProString *this_03;
  int local_3ec;
  ProStringList *in_stack_fffffffffffffc28;
  MakefileGenerator *in_stack_fffffffffffffc30;
  undefined1 local_390 [24];
  QString *local_378;
  undefined8 local_370;
  undefined1 local_368 [24];
  QString *local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  QStringBuilder<const_char_(&)[11],_ProString_&> local_2f8;
  ProString *local_2b8;
  iterator local_2b0;
  iterator local_2a8;
  QStringBuilder<const_char_(&)[11],_ProString_&> local_2a0;
  undefined1 local_230 [96];
  undefined1 local_1d0 [48];
  ProString *local_1a0;
  iterator local_198;
  iterator local_190 [7];
  ProString local_158 [2];
  undefined1 local_f8 [24];
  undefined1 local_e0 [24];
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  QString *local_80;
  undefined8 local_78;
  QString *local_70;
  undefined8 local_68;
  const_iterator local_60;
  const_iterator local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = (ProString *)in_RDI[0x1b];
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
  QMakeProject::values(in_stack_fffffffffffffbc0,(ProKey *)in_stack_fffffffffffffbb8);
  ProKey::~ProKey((ProKey *)0x186728);
  local_50 = 0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_40 = 0xaaaaaaaaaaaaaaaa;
  createObjectList(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  local_58.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_58 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffbc0);
  local_60.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_60 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffbc0);
  local_70 = (QString *)0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  local_80 = (QString *)0xaaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  do {
    cVar2 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffbc0);
    bVar1 = QList<ProString>::const_iterator::operator!=(&local_60,cVar2);
    uVar6 = false;
    if (bVar1) {
      cVar2 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffbc0);
      uVar6 = QList<ProString>::const_iterator::operator!=(&local_58,cVar2);
    }
    if ((bool)uVar6 == false) {
      ProStringList::~ProStringList((ProStringList *)0x1870f2);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    this_00 = QList<ProString>::const_iterator::operator*(&local_60);
    bVar1 = ProString::isEmpty(this_00);
    if (!bVar1) {
      local_98 = 0xaaaaaaaaaaaaaaaa;
      local_90 = 0xaaaaaaaaaaaaaaaa;
      local_88 = 0xaaaaaaaaaaaaaaaa;
      QList<ProString>::const_iterator::operator*(&local_60);
      ProString::toQString(in_stack_fffffffffffffbb8);
      local_b0 = 0xaaaaaaaaaaaaaaaa;
      local_a8 = 0xaaaaaaaaaaaaaaaa;
      local_a0 = 0xaaaaaaaaaaaaaaaa;
      QList<ProString>::const_iterator::operator*(&local_58);
      ProString::toQString(in_stack_fffffffffffffbb8);
      pQVar5 = in_RSI;
      (**(code **)(*in_RDI + 0x68))(local_c8,in_RDI,&local_b0);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)local_c8);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,": ");
      (**(code **)(*in_RDI + 0x68))(local_e0,in_RDI,&local_98);
      this_01 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)local_e0);
      this_02 = (QMakeProject *)QTextStream::operator<<(this_01," ");
      (**(code **)(*in_RDI + 0x80))(in_RDI,&local_98);
      finalizeDependencyPaths(in_stack_fffffffffffffbe0,(QStringList *)this_02);
      QString::QString((QString *)pQVar5,(char *)this_03);
      QListSpecialMethods<QString>::join((QListSpecialMethods<QString> *)this_02,(QString *)pQVar3);
      QTextStream::operator<<((QTextStream *)this_02,(QString *)local_f8);
      QString::~QString((QString *)0x186a5a);
      QString::~QString((QString *)0x186a67);
      QList<QString>::~QList((QList<QString> *)0x186a74);
      QString::~QString((QString *)0x186a81);
      QString::~QString((QString *)0x186a8e);
      memset(local_158,0xaa,0x30);
      ProString::ProString((ProString *)in_stack_fffffffffffffbc0);
      in_stack_fffffffffffffbe0 = (MakefileGenerator *)in_RDI[0x1b];
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
      pPVar4 = QMakeProject::values(in_stack_fffffffffffffbc0,(ProKey *)in_stack_fffffffffffffbb8);
      ProKey::~ProKey((ProKey *)0x186b1a);
      local_190[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_190[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffbc0);
      local_198.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_198 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffbc0);
      while( true ) {
        local_1a0 = local_198.i;
        bVar1 = QList<ProString>::iterator::operator!=(local_190,local_198);
        if (!bVar1) break;
        QList<ProString>::iterator::operator*(local_190);
        memset(local_1d0,0xaa,0x30);
        ProString::ProString((ProString *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        bVar1 = ProString::operator==((ProString *)in_stack_fffffffffffffbe0,(char *)this_02);
        if (bVar1) {
          ProString::ProString((ProString *)in_stack_fffffffffffffbc0,(char *)this_02);
          ProString::operator=((ProString *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          ProString::~ProString((ProString *)0x186c2e);
        }
        memset(local_230,0xaa,0x30);
        ProString::ProString((ProString *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        bVar1 = ProString::operator==((ProString *)in_stack_fffffffffffffbe0,(char *)this_02);
        if (bVar1) {
          ProString::ProString((ProString *)in_stack_fffffffffffffbc0,(char *)this_02);
          ProString::operator=((ProString *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          ProString::~ProString((ProString *)0x186ca7);
        }
        in_stack_fffffffffffffbb8 = (ProString *)in_RDI[0x1b];
        local_2a0 = ::operator+((char (*) [11])in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        ProKey::ProKey<char_const(&)[11],ProString&>
                  ((ProKey *)in_stack_fffffffffffffbc0,
                   (QStringBuilder<const_char_(&)[11],_ProString_&> *)in_stack_fffffffffffffbb8);
        in_stack_fffffffffffffbc0 =
             (QMakeProject *)
             QMakeProject::values(in_stack_fffffffffffffbc0,(ProKey *)in_stack_fffffffffffffbb8);
        ProKey::~ProKey((ProKey *)0x186d22);
        local_2a8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_2a8 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffbc0);
        local_2b0.i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_2b0 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffbc0);
        while( true ) {
          local_2b8 = local_2b0.i;
          bVar1 = QList<ProString>::iterator::operator!=(&local_2a8,local_2b0);
          if (!bVar1) break;
          QList<ProString>::iterator::operator*(&local_2a8);
          QList<ProString>::const_iterator::operator*(&local_60);
          bVar1 = ProString::endsWith(this_03,(ProString *)CONCAT17(uVar6,in_stack_fffffffffffffbf0)
                                      ,(CaseSensitivity)((ulong)pPVar4 >> 0x20));
          if (bVar1) {
            local_2f8 = ::operator+((char (*) [11])in_stack_fffffffffffffbc0,
                                    in_stack_fffffffffffffbb8);
            ProKey::ProKey<char_const(&)[11],ProString&>
                      ((ProKey *)in_stack_fffffffffffffbc0,
                       (QStringBuilder<const_char_(&)[11],_ProString_&> *)in_stack_fffffffffffffbb8)
            ;
            ProKey::operator=((ProKey *)in_stack_fffffffffffffbc0,
                              (ProKey *)in_stack_fffffffffffffbb8);
            ProKey::~ProKey((ProKey *)0x186e3d);
            break;
          }
          QList<ProString>::iterator::operator++(&local_2a8);
        }
        bVar1 = ProString::isNull((ProString *)0x186e60);
        if (bVar1) {
          local_3ec = 0;
        }
        else {
          local_3ec = 5;
        }
        ProString::~ProString((ProString *)0x186e83);
        ProString::~ProString((ProString *)0x186e90);
        if (local_3ec != 0) break;
        QList<ProString>::iterator::operator++(local_190);
      }
      bVar1 = ProString::isEmpty(local_158);
      if (bVar1) {
        ProKey::ProKey((ProKey *)in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
        ProKey::operator=((ProKey *)in_stack_fffffffffffffbc0,(ProKey *)in_stack_fffffffffffffbb8);
        ProKey::~ProKey((ProKey *)0x186ef9);
      }
      bVar1 = QMakeProject::isEmpty(this_02,(ProKey *)pQVar3);
      if (!bVar1) {
        local_340 = 0xaaaaaaaaaaaaaaaa;
        local_338 = 0xaaaaaaaaaaaaaaaa;
        local_330 = 0xaaaaaaaaaaaaaaaa;
        (**(code **)(*in_RDI + 0xb0))(&local_340,in_RDI,local_158);
        local_350 = local_70;
        local_348 = local_68;
        (**(code **)(*in_RDI + 0x60))(local_368,in_RDI,&local_98);
        QString::replace((QLatin1String *)&local_340,local_350,(CaseSensitivity)local_348);
        QString::~QString((QString *)0x186fd8);
        local_378 = local_80;
        local_370 = local_78;
        (**(code **)(*in_RDI + 0x60))(local_390,in_RDI,&local_b0);
        QString::replace((QLatin1String *)&local_340,local_378,(CaseSensitivity)local_370);
        QString::~QString((QString *)0x18704b);
        pQVar5 = (QTextStream *)QTextStream::operator<<(in_RSI,"\n\t");
        QTextStream::operator<<(pQVar5,(QString *)&local_340);
        QString::~QString((QString *)0x18707c);
      }
      ::operator<<((QTextStream *)in_stack_fffffffffffffbc0,
                   (QTextStreamFunction)in_stack_fffffffffffffbb8);
      ::operator<<((QTextStream *)in_stack_fffffffffffffbc0,
                   (QTextStreamFunction)in_stack_fffffffffffffbb8);
      ProKey::~ProKey((ProKey *)0x1870ac);
      QString::~QString((QString *)0x1870b9);
      QString::~QString((QString *)0x1870c6);
    }
    QList<ProString>::const_iterator::operator++(&local_58);
    QList<ProString>::const_iterator::operator++(&local_60);
  } while( true );
}

Assistant:

void
MakefileGenerator::writeObj(QTextStream &t, const char *src)
{
    const ProStringList &srcl = project->values(src);
    const ProStringList objl = createObjectList(srcl);

    ProStringList::ConstIterator oit = objl.begin();
    ProStringList::ConstIterator sit = srcl.begin();
    QLatin1String stringSrc("$src");
    QLatin1String stringObj("$obj");
    for(;sit != srcl.end() && oit != objl.end(); ++oit, ++sit) {
        if((*sit).isEmpty())
            continue;

        QString srcf = (*sit).toQString();
        QString dstf = (*oit).toQString();
        t << escapeDependencyPath(dstf) << ": " << escapeDependencyPath(srcf)
          << " " << finalizeDependencyPaths(findDependencies(srcf)).join(" \\\n\t\t");

        ProKey comp;
        for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
            // Unfortunately we were not consistent about the C++ naming
            ProString extensionSuffix = compiler;
            if (extensionSuffix == "CXX")
                extensionSuffix = ProString("CPP");

            // Nor the C naming
            ProString compilerSuffix = compiler;
            if (compilerSuffix == "C")
                compilerSuffix = ProString("CC");

            for (const ProString &extension : project->values(ProKey("QMAKE_EXT_" + extensionSuffix))) {
                if ((*sit).endsWith(extension)) {
                    comp = ProKey("QMAKE_RUN_" + compilerSuffix);
                    break;
                }
            }

            if (!comp.isNull())
                break;
        }

        if (comp.isEmpty())
            comp = "QMAKE_RUN_CC";
        if (!project->isEmpty(comp)) {
            QString p = var(comp);
            p.replace(stringSrc, escapeFilePath(srcf));
            p.replace(stringObj, escapeFilePath(dstf));
            t << "\n\t" << p;
        }
        t << Qt::endl << Qt::endl;
    }
}